

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,FILE *fp)

{
  bool bVar1;
  int iVar2;
  unsigned_long value;
  char *pcVar3;
  size_t sVar4;
  size_t read;
  size_t size;
  long filelength;
  FILE *fp_local;
  XMLDocument *this_local;
  
  Clear(this);
  fseek((FILE *)fp,0,0);
  iVar2 = fgetc((FILE *)fp);
  if ((iVar2 == -1) && (iVar2 = ferror((FILE *)fp), iVar2 != 0)) {
    SetError(this,XML_ERROR_FILE_READ_ERROR,0,(char *)0x0);
    return this->_errorID;
  }
  fseek((FILE *)fp,0,2);
  value = ftell((FILE *)fp);
  fseek((FILE *)fp,0,0);
  if (value == 0xffffffffffffffff) {
    SetError(this,XML_ERROR_FILE_READ_ERROR,0,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else {
    bVar1 = LongFitsIntoSizeTMinusOne<true>::Fits(value);
    if (bVar1) {
      if (value == 0) {
        SetError(this,XML_ERROR_EMPTY_DOCUMENT,0,(char *)0x0);
        this_local._4_4_ = this->_errorID;
      }
      else {
        pcVar3 = (char *)operator_new__(value + 1);
        this->_charBuffer = pcVar3;
        sVar4 = fread(this->_charBuffer,1,value,(FILE *)fp);
        if (sVar4 == value) {
          this->_charBuffer[value] = '\0';
          Parse(this);
          this_local._4_4_ = this->_errorID;
        }
        else {
          SetError(this,XML_ERROR_FILE_READ_ERROR,0,(char *)0x0);
          this_local._4_4_ = this->_errorID;
        }
      }
    }
    else {
      SetError(this,XML_ERROR_FILE_READ_ERROR,0,(char *)0x0);
      this_local._4_4_ = this->_errorID;
    }
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::LoadFile( FILE* fp )
{
    Clear();

    fseek( fp, 0, SEEK_SET );
    if ( fgetc( fp ) == EOF && ferror( fp ) != 0 ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    fseek( fp, 0, SEEK_END );
    const long filelength = ftell( fp );
    fseek( fp, 0, SEEK_SET );
    if ( filelength == -1L ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }
    TIXMLASSERT( filelength >= 0 );

    if ( !LongFitsIntoSizeTMinusOne<>::Fits( filelength ) ) {
        // Cannot handle files which won't fit in buffer together with null terminator
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( filelength == 0 ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }

    const size_t size = filelength;
    TIXMLASSERT( _charBuffer == 0 );
    _charBuffer = new char[size+1];
    const size_t read = fread( _charBuffer, 1, size, fp );
    if ( read != size ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    _charBuffer[size] = 0;

    Parse();
    return _errorID;
}